

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O3

int RescalePlane(uint8_t *src,int src_width,int src_height,int src_stride,uint8_t *dst,int dst_width
                ,int dst_height,int dst_stride,rescaler_t *work,int num_channels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  WebPRescaler rescaler;
  
  iVar1 = WebPRescalerInit(&rescaler,src_width,src_height,dst,dst_width,dst_height,dst_stride,
                           num_channels,work);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if (0 < src_height) {
      iVar3 = 0;
      do {
        iVar2 = WebPRescalerImport(&rescaler,src_height - iVar3,src + iVar3 * src_stride,src_stride)
        ;
        iVar3 = iVar3 + iVar2;
        WebPRescalerExport(&rescaler);
      } while (iVar3 < src_height);
    }
  }
  return iVar1;
}

Assistant:

static int RescalePlane(const uint8_t* src,
                        int src_width, int src_height, int src_stride,
                        uint8_t* dst,
                        int dst_width, int dst_height, int dst_stride,
                        rescaler_t* const work,
                        int num_channels) {
  WebPRescaler rescaler;
  int y = 0;
  if (!WebPRescalerInit(&rescaler, src_width, src_height,
                        dst, dst_width, dst_height, dst_stride,
                        num_channels, work)) {
    return 0;
  }
  while (y < src_height) {
    y += WebPRescalerImport(&rescaler, src_height - y,
                            src + y * src_stride, src_stride);
    WebPRescalerExport(&rescaler);
  }
  return 1;
}